

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CGUITabControl.cpp
# Opt level: O2

void __thiscall irr::gui::CGUITabControl::recalculateScrollButtonPlacement(CGUITabControl *this)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  long *plVar5;
  IGUIElement *this_00;
  EGUI_ALIGNMENT top;
  int iVar6;
  bool bVar7;
  int local_4c;
  rect<int> local_40;
  
  plVar5 = (long *)(**(code **)(**(long **)&this->field_0x128 + 0x60))();
  iVar6 = this->TabHeight;
  iVar3 = iVar6 + -2;
  if (iVar6 < 2) {
    iVar3 = iVar6;
  }
  if (plVar5 == (long *)0x0) {
    iVar4 = 0x10;
  }
  else {
    iVar4 = (**(code **)(*plVar5 + 0x10))(plVar5,2);
    iVar6 = this->TabHeight;
    if (iVar6 <= iVar4) {
      iVar4 = iVar6;
    }
  }
  iVar1 = *(int *)&this->field_0x30;
  iVar2 = *(int *)&this->field_0x38;
  bVar7 = this->VerticalAlignment == EGUIA_UPPERLEFT;
  if (bVar7) {
    local_4c = iVar3 / -2 + iVar6 / 2 + 2;
    IGUIElement::setAlignment
              (&this->UpButton->super_IGUIElement,EGUIA_LOWERRIGHT,EGUIA_LOWERRIGHT,EGUIA_UPPERLEFT,
               EGUIA_UPPERLEFT);
    this_00 = &this->DownButton->super_IGUIElement;
  }
  else {
    local_4c = ((iVar3 / -2 + *(int *)&this->field_0x3c) - *(int *)&this->field_0x34) + iVar6 / -2 +
               -2;
    IGUIElement::setAlignment
              (&this->UpButton->super_IGUIElement,EGUIA_LOWERRIGHT,EGUIA_LOWERRIGHT,EGUIA_LOWERRIGHT
               ,EGUIA_LOWERRIGHT);
    this_00 = &this->DownButton->super_IGUIElement;
  }
  top = (EGUI_ALIGNMENT)!bVar7;
  IGUIElement::setAlignment(this_00,EGUIA_LOWERRIGHT,EGUIA_LOWERRIGHT,top,top);
  iVar6 = ~(int)((float)iVar4 * 2.5) + (iVar2 - iVar1);
  local_40.UpperLeftCorner.Y = local_4c;
  local_40.UpperLeftCorner.X = iVar6;
  local_40.LowerRightCorner.X = iVar6 + iVar4;
  local_40.LowerRightCorner.Y = iVar3 + local_4c;
  IGUIElement::setRelativePosition(&this->UpButton->super_IGUIElement,&local_40);
  local_40.UpperLeftCorner.X = iVar4 + iVar6 + 1;
  local_40.LowerRightCorner.X = iVar4 + 1 + iVar6 + iVar4;
  local_40.UpperLeftCorner.Y = local_4c;
  local_40.LowerRightCorner.Y = iVar3 + local_4c;
  IGUIElement::setRelativePosition(&this->DownButton->super_IGUIElement,&local_40);
  return;
}

Assistant:

void CGUITabControl::recalculateScrollButtonPlacement()
{
	IGUISkin *skin = Environment->getSkin();
	s32 ButtonSize = 16;
	s32 ButtonHeight = TabHeight - 2;
	if (ButtonHeight < 0)
		ButtonHeight = TabHeight;
	if (skin) {
		ButtonSize = skin->getSize(EGDS_WINDOW_BUTTON_WIDTH);
		if (ButtonSize > TabHeight)
			ButtonSize = TabHeight;
	}

	s32 ButtonX = RelativeRect.getWidth() - (s32)(2.5f * (f32)ButtonSize) - 1;
	s32 ButtonY = 0;

	if (VerticalAlignment == EGUIA_UPPERLEFT) {
		ButtonY = 2 + (TabHeight / 2) - (ButtonHeight / 2);
		UpButton->setAlignment(EGUIA_LOWERRIGHT, EGUIA_LOWERRIGHT, EGUIA_UPPERLEFT, EGUIA_UPPERLEFT);
		DownButton->setAlignment(EGUIA_LOWERRIGHT, EGUIA_LOWERRIGHT, EGUIA_UPPERLEFT, EGUIA_UPPERLEFT);
	} else {
		ButtonY = RelativeRect.getHeight() - (TabHeight / 2) - (ButtonHeight / 2) - 2;
		UpButton->setAlignment(EGUIA_LOWERRIGHT, EGUIA_LOWERRIGHT, EGUIA_LOWERRIGHT, EGUIA_LOWERRIGHT);
		DownButton->setAlignment(EGUIA_LOWERRIGHT, EGUIA_LOWERRIGHT, EGUIA_LOWERRIGHT, EGUIA_LOWERRIGHT);
	}

	UpButton->setRelativePosition(core::rect<s32>(ButtonX, ButtonY, ButtonX + ButtonSize, ButtonY + ButtonHeight));
	ButtonX += ButtonSize + 1;
	DownButton->setRelativePosition(core::rect<s32>(ButtonX, ButtonY, ButtonX + ButtonSize, ButtonY + ButtonHeight));
}